

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O3

void print_its(strbuf *outbuf,int c)

{
  char *__s;
  size_t len;
  
  __s = print_its::map[c];
  len = strlen(__s);
  BinarySink_put_data(outbuf->binarysink_,__s,len);
  return;
}

Assistant:

static void print_its(strbuf *outbuf, int c)
{
    /* The ITS character set is documented in RFC 734. */
    static const char *map[] = {
        "\xc2\xb7",     "\342\206\223", "\316\261",     "\316\262",
        "\342\210\247", "\302\254",     "\316\265",     "\317\200",
        "\316\273",     "\xce\xb3",     "\xce\xb4",     "\xe2\x86\x91",
        "\xc2\xb1",     "\xe2\x8a\x95", "\342\210\236", "\342\210\202",
        "\342\212\202", "\342\212\203", "\342\210\251", "\342\210\252",
        "\342\210\200", "\342\210\203", "\xe2\x8a\x97", "\342\206\224",
        "\xe2\x86\x90", "\342\206\222", "\xe2\x89\xa0", "\xe2\x97\x8a",
        "\342\211\244", "\342\211\245", "\342\211\241", "\342\210\250",
        " ", "!", "\"", "#", "$", "%", "&", "'",
        "(", ")", "*", "+", ",", "-", ".", "/",
        "0", "1", "2", "3", "4", "5", "6", "7",
        "8", "9", ":", ";", "<", "=", ">", "?",
        "@", "A", "B", "C", "D", "E", "F", "G",
        "H", "I", "J", "K", "L", "M", "N", "O",
        "P", "Q", "R", "S", "T", "U", "V", "W",
        "X", "Y", "Z", "[", "\\", "]", "^", "_",
        "`", "a", "b", "c", "d", "e", "f", "g",
        "h", "i", "j", "k", "l", "m", "n", "o",
        "p", "q", "r", "s", "t", "u", "v", "w",
        "x", "y", "z", "{", "|", "}", "~", "\xe2\x88\xab"
    };

    put_data (outbuf, map[c], strlen(map[c]));
}